

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastMultiplier3
               (Gia_Man_t *pNew,int *pArgA,int *pArgB,int nArgA,int nArgB,Vec_Int_t *vRes,
               int fSigned,int fCla)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  Vec_Wec_t *vProds;
  Vec_Int_t *pVVar5;
  Vec_Wec_t *vLevels;
  Vec_Int_t *pVVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long local_80;
  
  uVar14 = (ulong)(uint)nArgA;
  iVar9 = nArgB + nArgA;
  vProds = (Vec_Wec_t *)malloc(0x10);
  uVar3 = (nArgB + nArgA) - 1;
  iVar11 = 8;
  if (6 < uVar3) {
    iVar11 = iVar9;
  }
  vProds->nSize = 0;
  vProds->nCap = iVar11;
  if (iVar11 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar11,0x10);
  }
  vProds->pArray = pVVar5;
  vProds->nSize = iVar9;
  vLevels = (Vec_Wec_t *)malloc(0x10);
  vLevels->nSize = 0;
  vLevels->nCap = iVar11;
  if (iVar11 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar11,0x10);
  }
  vLevels->pArray = pVVar5;
  vLevels->nSize = iVar9;
  if (0 < nArgA) {
    local_80 = 0;
    uVar15 = 0;
    do {
      if (0 < nArgB) {
        uVar12 = uVar15 & 0xffffffff;
        uVar8 = 0;
        lVar16 = local_80;
        do {
          uVar4 = Gia_ManHashAnd(pNew,pArgA[uVar15],pArgB[uVar8]);
          if ((int)uVar4 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          iVar11 = (int)uVar12;
          if (vProds->nSize <= iVar11) {
            uVar13 = vProds->nSize * 2;
            uVar7 = iVar11 + 1;
            if ((int)uVar13 <= (int)uVar7) {
              uVar13 = uVar7;
            }
            iVar10 = vProds->nCap;
            if (iVar10 < (int)uVar13) {
              if (vProds->pArray == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc((ulong)uVar13 << 4);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(vProds->pArray,(ulong)uVar13 << 4);
              }
              vProds->pArray = pVVar5;
              memset(pVVar5 + iVar10,0,(long)(int)(uVar13 - iVar10) << 4);
              vProds->nCap = uVar13;
            }
            vProds->nSize = uVar7;
          }
          if (vProds->nSize <= iVar11) goto LAB_00894e06;
          Vec_IntPush((Vec_Int_t *)((long)&vProds->pArray->nCap + lVar16),
                      uVar4 ^ (fSigned != 0 && (uVar15 == nArgA - 1) != (nArgB - 1 == uVar8)));
          if (vLevels->nSize <= iVar11) {
            uVar4 = vLevels->nSize * 2;
            uVar13 = iVar11 + 1;
            if ((int)uVar4 <= (int)uVar13) {
              uVar4 = uVar13;
            }
            iVar10 = vLevels->nCap;
            if (iVar10 < (int)uVar4) {
              if (vLevels->pArray == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(vLevels->pArray,(ulong)uVar4 << 4);
              }
              vLevels->pArray = pVVar5;
              memset(pVVar5 + iVar10,0,(long)(int)(uVar4 - iVar10) << 4);
              vLevels->nCap = uVar4;
            }
            vLevels->nSize = uVar13;
          }
          if (vLevels->nSize <= iVar11) goto LAB_00894e06;
          Vec_IntPush((Vec_Int_t *)((long)&vLevels->pArray->nCap + lVar16),0);
          uVar8 = uVar8 + 1;
          uVar12 = (ulong)(iVar11 + 1);
          lVar16 = lVar16 + 0x10;
        } while ((uint)nArgB != uVar8);
      }
      uVar15 = uVar15 + 1;
      local_80 = local_80 + 0x10;
    } while (uVar15 != uVar14);
  }
  if (fSigned != 0) {
    if (vProds->nSize <= nArgA) {
      iVar10 = nArgA + 1;
      iVar11 = vProds->nSize * 2;
      if (iVar11 <= iVar10) {
        iVar11 = iVar10;
      }
      iVar1 = vProds->nCap;
      if (iVar1 < iVar11) {
        if (vProds->pArray == (Vec_Int_t *)0x0) {
          pVVar5 = (Vec_Int_t *)malloc((long)iVar11 << 4);
        }
        else {
          pVVar5 = (Vec_Int_t *)realloc(vProds->pArray,(long)iVar11 << 4);
        }
        vProds->pArray = pVVar5;
        memset(pVVar5 + iVar1,0,(long)(iVar11 - iVar1) << 4);
        vProds->nCap = iVar11;
      }
      vProds->nSize = iVar10;
    }
    if ((-1 < nArgA) && (iVar11 = vProds->nSize, nArgA < iVar11)) {
      pVVar5 = vProds->pArray;
      Vec_IntPush(pVVar5 + uVar14,1);
      if (vLevels->nSize <= nArgA) {
        uVar13 = nArgA + 1;
        uVar4 = vLevels->nSize * 2;
        if ((int)uVar4 <= (int)uVar13) {
          uVar4 = uVar13;
        }
        iVar10 = vLevels->nCap;
        if (iVar10 < (int)uVar4) {
          if (vLevels->pArray == (Vec_Int_t *)0x0) {
            pVVar6 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
          }
          else {
            pVVar6 = (Vec_Int_t *)realloc(vLevels->pArray,(ulong)uVar4 << 4);
          }
          vLevels->pArray = pVVar6;
          memset(pVVar6 + iVar10,0,(long)(int)(uVar4 - iVar10) << 4);
          vLevels->nCap = uVar4;
        }
        vLevels->nSize = uVar13;
      }
      iVar10 = vLevels->nSize;
      if (nArgA < iVar10) {
        pVVar6 = vLevels->pArray;
        Vec_IntPush(pVVar6 + uVar14,0);
        if (iVar11 <= (int)uVar3) {
          iVar1 = iVar11 * 2;
          if (iVar11 * 2 <= iVar9) {
            iVar1 = iVar9;
          }
          iVar11 = vProds->nCap;
          if (iVar11 < iVar1) {
            if (pVVar5 == (Vec_Int_t *)0x0) {
              pVVar5 = (Vec_Int_t *)malloc((long)iVar1 << 4);
            }
            else {
              pVVar5 = (Vec_Int_t *)realloc(pVVar5,(long)iVar1 << 4);
            }
            vProds->pArray = pVVar5;
            memset(pVVar5 + iVar11,0,(long)(iVar1 - iVar11) << 4);
            vProds->nCap = iVar1;
          }
          vProds->nSize = iVar9;
        }
        if ((-1 < (int)uVar3) && ((int)uVar3 < vProds->nSize)) {
          Vec_IntPush(vProds->pArray + uVar3,1);
          if (iVar10 <= (int)uVar3) {
            iVar11 = iVar10 * 2;
            if (iVar10 * 2 <= iVar9) {
              iVar11 = iVar9;
            }
            iVar10 = vLevels->nCap;
            if (iVar10 < iVar11) {
              if (pVVar6 == (Vec_Int_t *)0x0) {
                pVVar5 = (Vec_Int_t *)malloc((long)iVar11 << 4);
              }
              else {
                pVVar5 = (Vec_Int_t *)realloc(pVVar6,(long)iVar11 << 4);
              }
              vLevels->pArray = pVVar5;
              memset(pVVar5 + iVar10,0,(long)(iVar11 - iVar10) << 4);
              vLevels->nCap = iVar11;
            }
            vLevels->nSize = iVar9;
          }
          if ((int)uVar3 < vLevels->nSize) {
            Vec_IntPush(vLevels->pArray + uVar3,0);
            goto LAB_00894d10;
          }
        }
      }
    }
LAB_00894e06:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
LAB_00894d10:
  Wlc_BlastReduceMatrix(pNew,vProds,vLevels,vRes,fSigned,fCla);
  iVar11 = vProds->nCap;
  if (0 < (long)iVar11) {
    pVVar5 = vProds->pArray;
    lVar16 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar5->pArray + lVar16);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar5->pArray + lVar16) = 0;
      }
      lVar16 = lVar16 + 0x10;
    } while ((long)iVar11 * 0x10 != lVar16);
  }
  if (vProds->pArray != (Vec_Int_t *)0x0) {
    free(vProds->pArray);
    vProds->pArray = (Vec_Int_t *)0x0;
  }
  vProds->nCap = 0;
  vProds->nSize = 0;
  free(vProds);
  iVar11 = vLevels->nCap;
  if (0 < (long)iVar11) {
    pVVar5 = vLevels->pArray;
    lVar16 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar5->pArray + lVar16);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar5->pArray + lVar16) = 0;
      }
      lVar16 = lVar16 + 0x10;
    } while ((long)iVar11 * 0x10 != lVar16);
  }
  if (vLevels->pArray != (Vec_Int_t *)0x0) {
    free(vLevels->pArray);
    vLevels->pArray = (Vec_Int_t *)0x0;
  }
  vLevels->nCap = 0;
  vLevels->nSize = 0;
  free(vLevels);
  return;
}

Assistant:

void Wlc_BlastMultiplier3( Gia_Man_t * pNew, int * pArgA, int * pArgB, int nArgA, int nArgB, Vec_Int_t * vRes, int fSigned, int fCla )
{
    Vec_Wec_t * vProds  = Vec_WecStart( nArgA + nArgB );
    Vec_Wec_t * vLevels = Vec_WecStart( nArgA + nArgB );
    int i, k;
    for ( i = 0; i < nArgA; i++ )
        for ( k = 0; k < nArgB; k++ )
        {
            int fCompl = fSigned && ((i == nArgA-1) ^ (k == nArgB-1));
            Vec_WecPush( vProds,  i+k, Abc_LitNotCond(Gia_ManHashAnd(pNew, pArgA[i], pArgB[k]), fCompl) );
            Vec_WecPush( vLevels, i+k, 0 );
        }
    if ( fSigned )
    {
        Vec_WecPush( vProds,  nArgA, 1 );
        Vec_WecPush( vLevels, nArgA, 0 );

        Vec_WecPush( vProds,  nArgA+nArgB-1, 1 );
        Vec_WecPush( vLevels, nArgA+nArgB-1, 0 );
    }

    Wlc_BlastReduceMatrix( pNew, vProds, vLevels, vRes, fSigned, fCla );
//    Wlc_BlastReduceMatrix2( pNew, vProds, vRes, fSigned, fCla );

    Vec_WecFree( vProds );
    Vec_WecFree( vLevels );
}